

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_archive.cpp
# Opt level: O3

char * ON_BinaryArchive::TypecodeName(uint tcode)

{
  if ((int)tcode < 0x400023) {
    if ((int)tcode < 0x10000) {
      if ((int)tcode < -0x7dffffef) {
        if ((int)tcode < -0x7fbfffde) {
          switch(tcode) {
          case 0x80400001:
            return "TCODE_RGB";
          case 0x80400002:
          case 0x80400003:
          case 0x80400007:
          case 0x80400008:
          case 0x80400009:
          case 0x8040000a:
          case 0x8040000b:
          case 0x8040000c:
          case 0x8040000d:
          case 0x8040000e:
          case 0x8040000f:
          case 0x80400010:
          case 0x80400011:
            break;
          case 0x80400004:
            return "TCODE_TRANSPARENCY";
          case 0x80400005:
            return "TCODE_DISP_AM_RESOLUTION";
          case 0x80400006:
            return "TCODE_RGBDISPLAY";
          case 0x80400012:
            return "TCODE_LAYERVISIBLE";
          case 0x80400013:
            return "TCODE_LAYER_OBSELETE_1";
          case 0x80400014:
            return "TCODE_LAYER_OBSELETE_2";
          case 0x80400015:
            return "TCODE_LAYER_OBSELETE_3";
          case 0x80400016:
            return "TCODE_LAYERON";
          case 0x80400017:
            return "TCODE_LAYERTHAWED";
          case 0x80400018:
            return "TCODE_LAYERLOCKED";
          default:
            if (tcode == 0x80027fff) {
              return "TCODE_OPENNURBS_CLASS_END";
            }
          }
        }
        else if ((int)tcode < -0x7dfffff9) {
          switch(tcode) {
          case 0x80400022:
            return "TCODE_DISP_CPLINES";
          case 0x80400025:
            return "TCODE_CURRENTLAYER";
          case 0x80400030:
            return "TCODE_LAYERPICKABLE";
          case 0x80400031:
            return "TCODE_LAYERSNAPABLE";
          case 0x80400032:
            return "TCODE_LAYERRENDERABLE";
          case 0x80400033:
            return "TCODE_LAYERSTATE";
          case 0x80400034:
            return "TCODE_LAYERINDEX";
          case 0x80400035:
            return "TCODE_LAYERMATERIALINDEX";
          }
        }
        else {
          if (tcode == 0x82000007) {
            return "TCODE_SHOWGRID";
          }
          if (tcode == 0x82000008) {
            return "TCODE_SHOWGRIDAXES";
          }
          if (tcode == 0x82000009) {
            return "TCODE_SHOWWORLDAXES";
          }
        }
      }
      else if ((int)tcode < -0x5ffffecd) {
        if ((int)tcode < -0x6fffffff) {
          if ((int)tcode < -0x7dffff91) {
            if (tcode == 0x82000011) {
              return "TCODE_MAXIMIZED_VIEWPORT";
            }
            if (tcode == 0x82000015) {
              return "TCODE_VIEWPORT_V1_DISPLAYMODE";
            }
          }
          else {
            if (tcode == 0x8200006f) {
              return "TCODE_LIGHT_RECORD_END";
            }
            if (tcode == 0x82000071) {
              return "TCODE_OBJECT_RECORD_TYPE";
            }
            if (tcode == 0x8200007f) {
              return "TCODE_OBJECT_RECORD_END";
            }
          }
        }
        else if ((int)tcode < -0x5fffffc8) {
          if (tcode == 0x90000001) {
            return "TCODE_LAYERTABLE";
          }
          if (tcode == 0xa0000001) {
            return "TCODE_LAYERREF";
          }
          if (tcode == 0xa0000026) {
            return "TCODE_PROPERTIES_OPENNURBS_VERSION";
          }
        }
        else {
          if (tcode == 0xa0000038) {
            return "TCODE_SETTINGS_CURRENT_LAYER_INDEX";
          }
          if (tcode == 0xa000003c) {
            return "TCODE_SETTINGS_CURRENT_WIRE_DENSITY";
          }
          if (tcode == 0xa0000132) {
            return "TCODE_SETTINGS_CURRENT_FONT_INDEX";
          }
        }
      }
      else if ((int)tcode < -1) {
        if ((int)tcode < -0x5ffffac5) {
          if (tcode == 0xa0000133) {
            return "TCODE_SETTINGS_CURRENT_DIMSTYLE_INDEX";
          }
          if (tcode == 0xa000033b) {
            return "TCODE_VIEW_SHOWCONGRID";
          }
          if (tcode == 0xa000043b) {
            return "TCODE_VIEW_SHOWCONAXES";
          }
        }
        else {
          if (tcode == 0xa000053b) {
            return "TCODE_VIEW_SHOWWORLDAXES";
          }
          if (tcode == 0xa000093b) {
            return "TCODE_VIEW_V3_DISPLAYMODE";
          }
          if (tcode == 0xc0000013) {
            return "TCODE_DICTIONARY_END";
          }
        }
      }
      else if ((int)tcode < 0x7ffe) {
        if (tcode == 0xffffffff) {
          return "TCODE_ENDOFTABLE";
        }
        if (tcode == 1) {
          return "TCODE_COMMENTBLOCK";
        }
        if (tcode == 0x100) {
          return "TCODE_STUFF";
        }
      }
      else {
        if (tcode == 0x7ffe) {
          return "TCODE_ENDOFFILE_GOO";
        }
        if (tcode == 0x7fff) {
          return "TCODE_ENDOFFILE";
        }
        if (tcode == 0x8000) {
          return "TCODE_CRC";
        }
      }
    }
    else if ((int)tcode < 0x2fff9) {
      if ((int)tcode < 0x10101) {
        switch(tcode) {
        case 0x10000:
          return "TCODE_LEGACY_GEOMETRY";
        case 0x10001:
          return "TCODE_LEGACY_ASM";
        case 0x10002:
          return "TCODE_LEGACY_PRT";
        case 0x10003:
          return "TCODE_LEGACY_SHL";
        case 0x10004:
          return "TCODE_LEGACY_FAC";
        case 0x10005:
          return "TCODE_LEGACY_BND";
        case 0x10006:
          return "TCODE_LEGACY_TRM";
        case 0x10007:
          return "TCODE_LEGACY_SRF";
        case 0x10008:
          return "TCODE_LEGACY_CRV";
        case 0x10009:
          return "TCODE_LEGACY_SPL";
        case 0x1000a:
          return "TCODE_LEGACY_PNT";
        }
      }
      else if ((int)tcode < 0x20000) {
        switch(tcode) {
        case 0x10101:
          return "TCODE_LEGACY_ASMSTUFF";
        case 0x10102:
          return "TCODE_LEGACY_PRTSTUFF";
        case 0x10103:
          return "TCODE_LEGACY_SHLSTUFF";
        case 0x10104:
          return "TCODE_LEGACY_FACSTUFF";
        case 0x10105:
          return "TCODE_LEGACY_BNDSTUFF";
        case 0x10106:
          return "TCODE_LEGACY_TRMSTUFF";
        case 0x10107:
          return "TCODE_LEGACY_SRFSTUFF";
        case 0x10108:
          return "TCODE_LEGACY_CRVSTUFF";
        case 0x10109:
          return "TCODE_LEGACY_SPLSTUFF";
        case 0x1010a:
          return "TCODE_LEGACY_PNTSTUFF";
        }
      }
      else if ((int)tcode < 0x2000b) {
        if (tcode == 0x20000) {
          return "TCODE_OPENNURBS_OBJECT";
        }
        if (tcode == 0x20008) {
          return "TCODE_RHINOIO_OBJECT_NURBS_CURVE";
        }
        if (tcode == 0x20009) {
          return "TCODE_RHINOIO_OBJECT_NURBS_SURFACE";
        }
      }
      else if ((int)tcode < 0x27ffd) {
        if (tcode == 0x2000b) {
          return "TCODE_RHINOIO_OBJECT_BREP";
        }
        if (tcode == 0x27ffa) {
          return "TCODE_OPENNURBS_CLASS";
        }
      }
      else {
        if (tcode == 0x27ffd) {
          return "TCODE_OPENNURBS_CLASS_USERDATA";
        }
        if (tcode == 0x28100) {
          return "TCODE_OPENNURBS_BUFFER";
        }
      }
    }
    else if ((int)tcode < 0x200000) {
      if ((int)tcode < 0x100011) {
        switch(tcode) {
        case 0x2fff9:
          return "TCODE_OPENNURBS_CLASS_USERDATA_HEADER";
        case 0x2fffa:
        case 0x2fffd:
          break;
        case 0x2fffb:
          return "TCODE_OPENNURBS_CLASS_UUID";
        case 0x2fffc:
          return "TCODE_OPENNURBS_CLASS_DATA";
        case 0x2fffe:
          return "TCODE_RHINOIO_OBJECT_DATA";
        case 0x2ffff:
          return "TCODE_RHINOIO_OBJECT_END";
        default:
          if (tcode == 0x100000) {
            return "TCODE_GEOMETRY";
          }
          if (tcode == 0x100001) {
            return "TCODE_RH_POINT";
          }
        }
      }
      else {
        switch(tcode) {
        case 0x100011:
          return "TCODE_OLD_RH_TRIMESH";
        case 0x100012:
          return "TCODE_OLD_MESH_VERTEX_NORMALS";
        case 0x100013:
          return "TCODE_OLD_MESH_UV";
        case 0x100014:
          return "TCODE_OLD_FULLMESH";
        case 0x100015:
          return "TCODE_MESH_OBJECT";
        case 0x100017:
          return "TCODE_COMPRESSED_MESH_GEOMETRY";
        case 0x100018:
          return "TCODE_ANALYSIS_MESH";
        }
      }
    }
    else if ((int)tcode < 0x400000) {
      switch(tcode) {
      case 0x200000:
        return "TCODE_ANNOTATION";
      case 0x200001:
        return "TCODE_ANNOTATION_SETTINGS";
      case 0x200004:
        return "TCODE_TEXT_BLOCK";
      case 0x200005:
        return "TCODE_ANNOTATION_LEADER";
      case 0x200006:
        return "TCODE_LINEAR_DIMENSION";
      case 0x200007:
        return "TCODE_ANGULAR_DIMENSION";
      case 0x200008:
        return "TCODE_RADIAL_DIMENSION";
      }
    }
    else if ((int)tcode < 0x400010) {
      switch(tcode) {
      case 0x400000:
        return "TCODE_DISPLAY";
      case 0x400002:
        return "TCODE_TEXTUREMAP";
      case 0x400003:
        return "TCODE_BUMPMAP";
      case 0x400007:
        return "TCODE_RENDER_MATERIAL_ID";
      }
    }
    else {
      if (tcode == 0x400010) {
        return "TCODE_LAYER";
      }
      if (tcode == 0x400011) {
        return "TCODE_LAYERNAME";
      }
      if (tcode == 0x400020) {
        return "TCODE_RENDERMESHPARAMS";
      }
    }
  }
  else if ((int)tcode < 0x20008021) {
    if ((int)tcode < 0x8000000) {
      if ((int)tcode < 0x2000073) {
        if ((int)tcode < 0x2000000) {
          if (tcode == 0x400023) {
            return "TCODE_DISP_MAXLENGTH";
          }
          if (tcode == 0x800000) {
            return "TCODE_RENDER";
          }
          if (tcode == 0x800001) {
            return "TCODE_RH_SPOTLIGHT";
          }
        }
        else {
          switch(tcode) {
          case 0x2000000:
            return "TCODE_INTERFACE";
          case 0x2000001:
            return "TCODE_NAME";
          case 0x2000002:
            return "TCODE_VIEW";
          case 0x2000003:
            return "TCODE_CPLANE";
          case 0x2000004:
            return "TCODE_NAMED_CPLANE";
          case 0x2000005:
            return "TCODE_NAMED_VIEW";
          case 0x2000006:
            return "TCODE_VIEWPORT";
          case 0x200000a:
            return "TCODE_VIEWPORT_POSITION";
          case 0x200000b:
            return "TCODE_VIEWPORT_TRACEINFO";
          case 0x200000c:
            return "TCODE_SNAPSIZE";
          case 0x200000d:
            return "TCODE_NEAR_CLIP_PLANE";
          case 0x200000e:
            return "TCODE_HIDE_TRACE";
          case 0x200000f:
            return "TCODE_NOTES";
          case 0x2000010:
            return "TCODE_UNIT_AND_TOLERANCES";
          case 0x2000012:
            return "TCODE_VIEWPORT_WALLPAPER";
          case 0x2000013:
            return "TCODE_SUMMARY";
          case 0x2000014:
            return "TCODE_BITMAPPREVIEW";
          }
        }
      }
      else {
        switch(tcode) {
        case 0x2008072:
          return "TCODE_OBJECT_RECORD_ATTRIBUTES";
        case 0x2008073:
          break;
        case 0x2008074:
          return "TCODE_OBJECT_RECORD_HISTORY";
        case 0x2008075:
          return "TCODE_OBJECT_RECORD_HISTORY_HEADER";
        case 0x2008076:
          return "TCODE_OBJECT_RECORD_HISTORY_DATA";
        default:
          if (tcode == 0x2000073) {
            return "TCODE_OBJECT_RECORD_ATTRIBUTES_USERDATA";
          }
          if (tcode == 0x2008061) {
            return "TCODE_LIGHT_RECORD_ATTRIBUTES";
          }
        }
      }
    }
    else if ((int)tcode < 0x10000000) {
      if (tcode == 0x8000000) {
        return "TCODE_TOLERANCE";
      }
      if (tcode == 0x8000001) {
        return "TCODE_LEGACY_TOL_FIT";
      }
      if (tcode == 0x8000002) {
        return "TCODE_LEGACY_TOL_ANGLE";
      }
    }
    else {
      switch(tcode) {
      case 0x10000000:
        return "TCODE_TABLE";
      case 0x10000001:
      case 0x10000002:
      case 0x10000003:
      case 0x10000004:
      case 0x10000005:
      case 0x10000006:
      case 0x10000007:
      case 0x10000008:
      case 0x10000009:
      case 0x1000000a:
      case 0x1000000b:
      case 0x1000000c:
      case 0x1000000d:
      case 0x1000000e:
      case 0x1000000f:
      case 0x1000001a:
      case 0x1000001b:
      case 0x1000001c:
      case 0x1000001d:
      case 0x1000001e:
      case 0x1000001f:
        break;
      case 0x10000010:
        return "TCODE_MATERIAL_TABLE";
      case 0x10000011:
        return "TCODE_LAYER_TABLE";
      case 0x10000012:
        return "TCODE_LIGHT_TABLE";
      case 0x10000013:
        return "TCODE_OBJECT_TABLE";
      case 0x10000014:
        return "TCODE_PROPERTIES_TABLE";
      case 0x10000015:
        return "TCODE_SETTINGS_TABLE";
      case 0x10000016:
        return "TCODE_BITMAP_TABLE";
      case 0x10000017:
        return "TCODE_USER_TABLE";
      case 0x10000018:
        return "TCODE_GROUP_TABLE";
      case 0x10000019:
        return "TCODE_FONT_TABLE";
      case 0x10000020:
        return "TCODE_DIMSTYLE_TABLE";
      case 0x10000021:
        return "TCODE_INSTANCE_DEFINITION_TABLE";
      case 0x10000022:
        return "TCODE_HATCHPATTERN_TABLE";
      case 0x10000023:
        return "TCODE_LINETYPE_TABLE";
      case 0x10000024:
        return "TCODE_OBSOLETE_LAYERSET_TABLE";
      case 0x10000025:
        return "TCODE_TEXTURE_MAPPING_TABLE";
      case 0x10000026:
        return "TCODE_HISTORYRECORD_TABLE";
      default:
        if (tcode == 0x20000000) {
          return "TCODE_TABLEREC";
        }
        if (tcode == 0x20000081) {
          return "TCODE_USER_RECORD";
        }
      }
    }
  }
  else if ((int)tcode < 0x20008073) {
    switch(tcode) {
    case 0x20008021:
      return "TCODE_PROPERTIES_REVISIONHISTORY";
    case 0x20008022:
      return "TCODE_PROPERTIES_NOTES";
    case 0x20008023:
      return "TCODE_PROPERTIES_PREVIEWIMAGE";
    case 0x20008024:
      return "TCODE_PROPERTIES_APPLICATION";
    case 0x20008025:
      return "TCODE_PROPERTIES_COMPRESSED_PREVIEWIMAGE";
    case 0x20008026:
    case 0x20008027:
    case 0x20008028:
    case 0x20008029:
    case 0x2000802a:
    case 0x2000802b:
    case 0x2000802c:
    case 0x2000802d:
    case 0x2000802e:
    case 0x2000802f:
    case 0x20008030:
    case 0x20008038:
    case 0x2000803c:
    case 0x20008041:
    case 0x20008042:
    case 0x20008043:
    case 0x20008044:
    case 0x20008045:
    case 0x20008046:
    case 0x20008047:
    case 0x20008048:
    case 0x20008049:
    case 0x2000804a:
    case 0x2000804b:
    case 0x2000804c:
    case 0x2000804d:
    case 0x2000804e:
    case 0x2000804f:
      break;
    case 0x20008031:
      return "TCODE_SETTINGS_UNITSANDTOLS";
    case 0x20008032:
      return "TCODE_SETTINGS_RENDERMESH";
    case 0x20008033:
      return "TCODE_SETTINGS_ANALYSISMESH";
    case 0x20008034:
      return "TCODE_SETTINGS_ANNOTATION";
    case 0x20008035:
      return "TCODE_SETTINGS_NAMED_CPLANE_LIST";
    case 0x20008036:
      return "TCODE_SETTINGS_NAMED_VIEW_LIST";
    case 0x20008037:
      return "TCODE_SETTINGS_VIEW_LIST";
    case 0x20008039:
      return "TCODE_SETTINGS_CURRENT_MATERIAL_INDEX";
    case 0x2000803a:
      return "TCODE_SETTINGS_CURRENT_COLOR";
    case 0x2000803b:
      return "TCODE_VIEW_RECORD";
    case 0x2000803d:
      return "TCODE_SETTINGS_RENDER";
    case 0x2000803e:
      return "TCODE_SETTINGS__NEVER__USE__THIS";
    case 0x2000803f:
      return "TCODE_SETTINGS_GRID_DEFAULTS";
    case 0x20008040:
      return "TCODE_MATERIAL_RECORD";
    case 0x20008050:
      return "TCODE_LAYER_RECORD";
    default:
      if (tcode == 0x20008060) {
        return "TCODE_LIGHT_RECORD";
      }
      if (tcode == 0x20008070) {
        return "TCODE_OBJECT_RECORD";
      }
    }
  }
  else if ((int)tcode < 0x2000823b) {
    switch(tcode) {
    case 0x20008073:
      return "TCODE_GROUP_RECORD";
    case 0x20008074:
      return "TCODE_FONT_RECORD";
    case 0x20008075:
      return "TCODE_DIMSTYLE_RECORD";
    case 0x20008076:
      return "TCODE_INSTANCE_DEFINITION_RECORD";
    case 0x20008077:
      return "TCODE_HATCHPATTERN_RECORD";
    case 0x20008078:
      return "TCODE_LINETYPE_RECORD";
    case 0x20008079:
      return "TCODE_OBSOLETE_LAYERSET_RECORD";
    case 0x2000807a:
      return "TCODE_TEXTURE_MAPPING_RECORD";
    case 0x2000807b:
      return "TCODE_HISTORYRECORD_RECORD";
    case 0x2000807c:
    case 0x2000807d:
    case 0x2000807e:
    case 0x2000807f:
    case 0x20008081:
    case 0x20008083:
    case 0x20008084:
    case 0x20008085:
    case 0x20008086:
    case 0x20008087:
    case 0x20008088:
    case 0x20008089:
    case 0x2000808a:
    case 0x2000808b:
    case 0x2000808c:
    case 0x2000808d:
    case 0x2000808e:
    case 0x2000808f:
      break;
    case 0x20008080:
      return "TCODE_USER_TABLE_UUID";
    case 0x20008082:
      return "TCODE_USER_TABLE_RECORD_HEADER";
    case 0x20008090:
      return "TCODE_BITMAP_RECORD";
    default:
      switch(tcode) {
      case 0x20008131:
        return "TCODE_SETTINGS_MODEL_URL";
      case 0x20008134:
        return "TCODE_SETTINGS_ATTRIBUTES";
      case 0x20008135:
        return "TCODE_SETTINGS_PLUGINLIST";
      case 0x20008136:
        return "TCODE_SETTINGS_RENDER_USERDATA";
      case 0x2000813b:
        return "TCODE_VIEW_CPLANE";
      }
    }
  }
  else if ((int)tcode < 0x20008c3b) {
    if ((int)tcode < 0x2000874b) {
      if (tcode == 0x2000823b) {
        return "TCODE_VIEW_VIEWPORT";
      }
      if (tcode == 0x2000863b) {
        return "TCODE_VIEW_TRACEIMAGE";
      }
      if (tcode == 0x2000873b) {
        return "TCODE_VIEW_WALLPAPER";
      }
    }
    else if ((int)tcode < 0x20008a3b) {
      if (tcode == 0x2000874b) {
        return "TCODE_VIEW_WALLPAPER_V3";
      }
      if (tcode == 0x2000883b) {
        return "TCODE_VIEW_TARGET";
      }
    }
    else {
      if (tcode == 0x20008a3b) {
        return "TCODE_VIEW_NAME";
      }
      if (tcode == 0x20008b3b) {
        return "TCODE_VIEW_POSITION";
      }
    }
  }
  else if ((int)tcode < 0x40008000) {
    if ((int)tcode < 0x40000000) {
      if (tcode == 0x20008c3b) {
        return "TCODE_VIEW_ATTRIBUTES";
      }
      if (tcode == 0x20008d3b) {
        return "TCODE_VIEW_VIEWPORT_USERDATA";
      }
    }
    else {
      if (tcode == 0x40000000) {
        return "TCODE_USER";
      }
      if (tcode == 0x40000001) {
        return "TCODE_XDATA";
      }
    }
  }
  else if ((int)tcode < 0x40008011) {
    if (tcode == 0x40008000) {
      return "TCODE_ANONYMOUS_CHUNK";
    }
    if (tcode == 0x40008010) {
      return "TCODE_DICTIONARY";
    }
  }
  else {
    if (tcode == 0x40008011) {
      return "TCODE_DICTIONARY_ID";
    }
    if (tcode == 0x40008012) {
      return "TCODE_DICTIONARY_ENTRY";
    }
  }
  return (char *)0x0;
}

Assistant:

const char* ON_BinaryArchive::TypecodeName( unsigned int tcode )
{

  const char* s;
  switch( tcode ) 
  {
  CASEtcode2string(TCODE_FONT_TABLE);
  CASEtcode2string(TCODE_FONT_RECORD);
  CASEtcode2string(TCODE_DIMSTYLE_TABLE);
  CASEtcode2string(TCODE_DIMSTYLE_RECORD);
  CASEtcode2string(TCODE_INSTANCE_DEFINITION_RECORD);
  CASEtcode2string(TCODE_COMMENTBLOCK);
  CASEtcode2string(TCODE_ENDOFFILE);
  CASEtcode2string(TCODE_ENDOFFILE_GOO);
  CASEtcode2string(TCODE_LEGACY_GEOMETRY);
  CASEtcode2string(TCODE_OPENNURBS_OBJECT);
  CASEtcode2string(TCODE_GEOMETRY);
  CASEtcode2string(TCODE_ANNOTATION);
  CASEtcode2string(TCODE_DISPLAY);
  CASEtcode2string(TCODE_RENDER);
  CASEtcode2string(TCODE_INTERFACE);
  CASEtcode2string(TCODE_TOLERANCE);
  CASEtcode2string(TCODE_TABLE);
  CASEtcode2string(TCODE_TABLEREC);
  CASEtcode2string(TCODE_USER);
  CASEtcode2string(TCODE_SHORT);
  CASEtcode2string(TCODE_CRC);
  CASEtcode2string(TCODE_ANONYMOUS_CHUNK);
  CASEtcode2string(TCODE_MATERIAL_TABLE);
  CASEtcode2string(TCODE_LAYER_TABLE);
  CASEtcode2string(TCODE_LIGHT_TABLE);
  CASEtcode2string(TCODE_OBJECT_TABLE);
  CASEtcode2string(TCODE_PROPERTIES_TABLE);
  CASEtcode2string(TCODE_SETTINGS_TABLE);
  CASEtcode2string(TCODE_BITMAP_TABLE);
  CASEtcode2string(TCODE_USER_TABLE);
  CASEtcode2string(TCODE_INSTANCE_DEFINITION_TABLE);
  CASEtcode2string(TCODE_HATCHPATTERN_TABLE);
  CASEtcode2string(TCODE_HATCHPATTERN_RECORD);
  CASEtcode2string(TCODE_LINETYPE_TABLE);
  CASEtcode2string(TCODE_LINETYPE_RECORD);
  CASEtcode2string(TCODE_OBSOLETE_LAYERSET_TABLE);
  CASEtcode2string(TCODE_OBSOLETE_LAYERSET_RECORD);
  CASEtcode2string(TCODE_TEXTURE_MAPPING_TABLE);
  CASEtcode2string(TCODE_TEXTURE_MAPPING_RECORD);
  CASEtcode2string(TCODE_HISTORYRECORD_TABLE);  
  CASEtcode2string(TCODE_HISTORYRECORD_RECORD);
  CASEtcode2string(TCODE_ENDOFTABLE);
  CASEtcode2string(TCODE_PROPERTIES_REVISIONHISTORY);
  CASEtcode2string(TCODE_PROPERTIES_NOTES);
  CASEtcode2string(TCODE_PROPERTIES_PREVIEWIMAGE);
  CASEtcode2string(TCODE_PROPERTIES_COMPRESSED_PREVIEWIMAGE);
  CASEtcode2string(TCODE_PROPERTIES_APPLICATION);
  CASEtcode2string(TCODE_PROPERTIES_OPENNURBS_VERSION);
  CASEtcode2string(TCODE_SETTINGS_PLUGINLIST);
  CASEtcode2string(TCODE_SETTINGS_UNITSANDTOLS);
  CASEtcode2string(TCODE_SETTINGS_RENDERMESH);
  CASEtcode2string(TCODE_SETTINGS_ANALYSISMESH);
  CASEtcode2string(TCODE_SETTINGS_ANNOTATION);
  CASEtcode2string(TCODE_SETTINGS_NAMED_CPLANE_LIST);
  CASEtcode2string(TCODE_SETTINGS_NAMED_VIEW_LIST);
  CASEtcode2string(TCODE_SETTINGS_VIEW_LIST);
  CASEtcode2string(TCODE_SETTINGS_CURRENT_LAYER_INDEX);
  CASEtcode2string(TCODE_SETTINGS_CURRENT_MATERIAL_INDEX);
  CASEtcode2string(TCODE_SETTINGS_CURRENT_COLOR);
  CASEtcode2string(TCODE_SETTINGS__NEVER__USE__THIS);
  CASEtcode2string(TCODE_SETTINGS_CURRENT_WIRE_DENSITY);
  CASEtcode2string(TCODE_SETTINGS_RENDER);
  CASEtcode2string(TCODE_SETTINGS_GRID_DEFAULTS);
  CASEtcode2string(TCODE_SETTINGS_MODEL_URL);
  CASEtcode2string(TCODE_SETTINGS_CURRENT_FONT_INDEX);
  CASEtcode2string(TCODE_SETTINGS_CURRENT_DIMSTYLE_INDEX);
  CASEtcode2string(TCODE_SETTINGS_ATTRIBUTES);
  CASEtcode2string(TCODE_SETTINGS_RENDER_USERDATA);
  CASEtcode2string(TCODE_VIEW_RECORD);
  CASEtcode2string(TCODE_VIEW_CPLANE);
  CASEtcode2string(TCODE_VIEW_VIEWPORT);
  CASEtcode2string(TCODE_VIEW_VIEWPORT_USERDATA);
  CASEtcode2string(TCODE_VIEW_SHOWCONGRID);
  CASEtcode2string(TCODE_VIEW_SHOWCONAXES);
  CASEtcode2string(TCODE_VIEW_SHOWWORLDAXES);
  CASEtcode2string(TCODE_VIEW_TRACEIMAGE);
  CASEtcode2string(TCODE_VIEW_WALLPAPER);
  CASEtcode2string(TCODE_VIEW_WALLPAPER_V3);
  CASEtcode2string(TCODE_VIEW_TARGET);
  CASEtcode2string(TCODE_VIEW_V3_DISPLAYMODE);
  CASEtcode2string(TCODE_VIEW_NAME);
  CASEtcode2string(TCODE_VIEW_POSITION);
  CASEtcode2string(TCODE_VIEW_ATTRIBUTES);
  CASEtcode2string(TCODE_BITMAP_RECORD);
  CASEtcode2string(TCODE_MATERIAL_RECORD);
  CASEtcode2string(TCODE_LAYER_RECORD);
  CASEtcode2string(TCODE_LIGHT_RECORD);
  CASEtcode2string(TCODE_LIGHT_RECORD_ATTRIBUTES);
  CASEtcode2string(TCODE_OBJECT_RECORD_ATTRIBUTES_USERDATA);
  CASEtcode2string(TCODE_OBJECT_RECORD_HISTORY);
  CASEtcode2string(TCODE_OBJECT_RECORD_HISTORY_HEADER);
  CASEtcode2string(TCODE_OBJECT_RECORD_HISTORY_DATA);
  CASEtcode2string(TCODE_LIGHT_RECORD_END);
  CASEtcode2string(TCODE_USER_TABLE_UUID);
  CASEtcode2string(TCODE_USER_TABLE_RECORD_HEADER);
  CASEtcode2string(TCODE_USER_RECORD);
  CASEtcode2string(TCODE_GROUP_TABLE);
  CASEtcode2string(TCODE_GROUP_RECORD);
  CASEtcode2string(TCODE_OBJECT_RECORD);
  CASEtcode2string(TCODE_OBJECT_RECORD_TYPE);
  CASEtcode2string(TCODE_OBJECT_RECORD_ATTRIBUTES);
  CASEtcode2string(TCODE_OBJECT_RECORD_END);
  CASEtcode2string(TCODE_OPENNURBS_CLASS);
  CASEtcode2string(TCODE_OPENNURBS_CLASS_UUID);
  CASEtcode2string(TCODE_OPENNURBS_CLASS_DATA);
  CASEtcode2string(TCODE_OPENNURBS_CLASS_USERDATA);
  CASEtcode2string(TCODE_OPENNURBS_CLASS_USERDATA_HEADER);
  CASEtcode2string(TCODE_OPENNURBS_CLASS_END);
  CASEtcode2string(TCODE_OPENNURBS_BUFFER);
  CASEtcode2string(TCODE_ANNOTATION_SETTINGS);
  CASEtcode2string(TCODE_TEXT_BLOCK);
  CASEtcode2string(TCODE_ANNOTATION_LEADER);
  CASEtcode2string(TCODE_LINEAR_DIMENSION);
  CASEtcode2string(TCODE_ANGULAR_DIMENSION);
  CASEtcode2string(TCODE_RADIAL_DIMENSION);
  CASEtcode2string(TCODE_RHINOIO_OBJECT_NURBS_CURVE);
  CASEtcode2string(TCODE_RHINOIO_OBJECT_NURBS_SURFACE);
  CASEtcode2string(TCODE_RHINOIO_OBJECT_BREP);
  CASEtcode2string(TCODE_RHINOIO_OBJECT_DATA);
  CASEtcode2string(TCODE_RHINOIO_OBJECT_END);
  CASEtcode2string(TCODE_LEGACY_ASM);
  CASEtcode2string(TCODE_LEGACY_PRT);
  CASEtcode2string(TCODE_LEGACY_SHL);
  CASEtcode2string(TCODE_LEGACY_FAC);
  CASEtcode2string(TCODE_LEGACY_BND);
  CASEtcode2string(TCODE_LEGACY_TRM);
  CASEtcode2string(TCODE_LEGACY_SRF);
  CASEtcode2string(TCODE_LEGACY_CRV);
  CASEtcode2string(TCODE_LEGACY_SPL);
  CASEtcode2string(TCODE_LEGACY_PNT);
  CASEtcode2string(TCODE_STUFF);
  CASEtcode2string(TCODE_LEGACY_ASMSTUFF);
  CASEtcode2string(TCODE_LEGACY_PRTSTUFF);
  CASEtcode2string(TCODE_LEGACY_SHLSTUFF);
  CASEtcode2string(TCODE_LEGACY_FACSTUFF);
  CASEtcode2string(TCODE_LEGACY_BNDSTUFF);
  CASEtcode2string(TCODE_LEGACY_TRMSTUFF);
  CASEtcode2string(TCODE_LEGACY_SRFSTUFF);
  CASEtcode2string(TCODE_LEGACY_CRVSTUFF);
  CASEtcode2string(TCODE_LEGACY_SPLSTUFF);
  CASEtcode2string(TCODE_LEGACY_PNTSTUFF);
  CASEtcode2string(TCODE_RH_POINT);
  CASEtcode2string(TCODE_RH_SPOTLIGHT);
  CASEtcode2string(TCODE_OLD_RH_TRIMESH);
  CASEtcode2string(TCODE_OLD_MESH_VERTEX_NORMALS);
  CASEtcode2string(TCODE_OLD_MESH_UV);
  CASEtcode2string(TCODE_OLD_FULLMESH);
  CASEtcode2string(TCODE_MESH_OBJECT);
  CASEtcode2string(TCODE_COMPRESSED_MESH_GEOMETRY);
  CASEtcode2string(TCODE_ANALYSIS_MESH);
  CASEtcode2string(TCODE_NAME);
  CASEtcode2string(TCODE_VIEW);
  CASEtcode2string(TCODE_CPLANE);
  CASEtcode2string(TCODE_NAMED_CPLANE);
  CASEtcode2string(TCODE_NAMED_VIEW);
  CASEtcode2string(TCODE_VIEWPORT);
  CASEtcode2string(TCODE_SHOWGRID);
  CASEtcode2string(TCODE_SHOWGRIDAXES);
  CASEtcode2string(TCODE_SHOWWORLDAXES);
  CASEtcode2string(TCODE_VIEWPORT_POSITION);
  CASEtcode2string(TCODE_VIEWPORT_TRACEINFO);
  CASEtcode2string(TCODE_SNAPSIZE);
  CASEtcode2string(TCODE_NEAR_CLIP_PLANE);
  CASEtcode2string(TCODE_HIDE_TRACE);
  CASEtcode2string(TCODE_NOTES);
  CASEtcode2string(TCODE_UNIT_AND_TOLERANCES);
  CASEtcode2string(TCODE_MAXIMIZED_VIEWPORT);
  CASEtcode2string(TCODE_VIEWPORT_WALLPAPER);
  CASEtcode2string(TCODE_SUMMARY);
  CASEtcode2string(TCODE_BITMAPPREVIEW);
  CASEtcode2string(TCODE_VIEWPORT_V1_DISPLAYMODE);
  CASEtcode2string(TCODE_LAYERTABLE);
  CASEtcode2string(TCODE_LAYERREF);
  CASEtcode2string(TCODE_XDATA);
  CASEtcode2string(TCODE_RGB);
  CASEtcode2string(TCODE_TEXTUREMAP);
  CASEtcode2string(TCODE_BUMPMAP);
  CASEtcode2string(TCODE_TRANSPARENCY);
  CASEtcode2string(TCODE_DISP_AM_RESOLUTION);
  CASEtcode2string(TCODE_RGBDISPLAY);
  CASEtcode2string(TCODE_RENDER_MATERIAL_ID);
  CASEtcode2string(TCODE_LAYER);
  CASEtcode2string(TCODE_LAYER_OBSELETE_1);
  CASEtcode2string(TCODE_LAYER_OBSELETE_2);
  CASEtcode2string(TCODE_LAYER_OBSELETE_3);
  CASEtcode2string(TCODE_LAYERON);
  CASEtcode2string(TCODE_LAYERTHAWED);
  CASEtcode2string(TCODE_LAYERLOCKED);
  CASEtcode2string(TCODE_LAYERVISIBLE);
  CASEtcode2string(TCODE_LAYERPICKABLE);
  CASEtcode2string(TCODE_LAYERSNAPABLE);
  CASEtcode2string(TCODE_LAYERRENDERABLE);
  CASEtcode2string(TCODE_LAYERSTATE);
  CASEtcode2string(TCODE_LAYERINDEX);
  CASEtcode2string(TCODE_LAYERMATERIALINDEX);
  CASEtcode2string(TCODE_RENDERMESHPARAMS);
  CASEtcode2string(TCODE_DISP_CPLINES);
  CASEtcode2string(TCODE_DISP_MAXLENGTH);
  CASEtcode2string(TCODE_CURRENTLAYER);
  CASEtcode2string(TCODE_LAYERNAME);
  CASEtcode2string(TCODE_LEGACY_TOL_FIT);
  CASEtcode2string(TCODE_LEGACY_TOL_ANGLE);
  CASEtcode2string(TCODE_DICTIONARY);
  CASEtcode2string(TCODE_DICTIONARY_ID);
  CASEtcode2string(TCODE_DICTIONARY_ENTRY);
  CASEtcode2string(TCODE_DICTIONARY_END);
  default:
    // unknown typecode.
    s = 0; 
    break;
  }
  return s;
}